

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_copy(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  TCGTemp *ts;
  TCGv_i64 pTVar2;
  uint32_t uVar3;
  uint destidx;
  MemOp MVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint srcidx;
  uint uVar8;
  
  destidx = insn & 0x1f;
  srcidx = insn >> 5 & 0x1f;
  uVar5 = insn >> 0xb & 0xf;
  uVar7 = insn >> 0x1e;
  uVar8 = insn >> 0x10 & 0x1f;
  bVar6 = (byte)(insn >> 0x1e);
  if ((insn >> 0x1d & 1) != 0) {
    if ((uVar7 & 1) != 0) {
      if (uVar8 == 0) {
        MVar4 = MO_ALIGN_4;
      }
      else {
        MVar4 = MO_8;
        if (uVar8 != 0) {
          for (; (uVar8 >> MVar4 & 1) == 0; MVar4 = MVar4 + MO_16) {
          }
        }
      }
      if (MVar4 < MO_ASHIFT) {
        if (s->fp_access_checked == true) goto LAB_006a8ec5;
        pTVar1 = s->uc->tcg_ctx;
        s->fp_access_checked = true;
        uVar3 = s->fp_excp_el;
        if (uVar3 == 0) {
          ts = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,
                           (TCGv_i64)((long)ts - (long)pTVar1),srcidx,uVar5 >> ((byte)MVar4 & 0x1f),
                           MVar4);
          write_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,
                            (TCGv_i64)((long)ts - (long)pTVar1),destidx,
                            uVar8 >> ((byte)MVar4 + 1 & 0x1f),MVar4);
          tcg_temp_free_internal_aarch64(pTVar1,ts);
LAB_006a8b7c:
          if ((uint)s->sve_len < 0x11) {
            return;
          }
          uVar3 = s->sve_len - 0x10;
          tcg_gen_gvec_dup8i_aarch64(s->uc->tcg_ctx,destidx * 0x100 + 0xc20,uVar3,uVar3,'\0');
          return;
        }
        goto LAB_006a8e3e;
      }
    }
    goto switchD_006a8a92_caseD_2;
  }
  switch(uVar5) {
  case 0:
    if (uVar8 == 0) {
      uVar5 = 0x20;
    }
    else {
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
    }
    if ((uVar5 < 4) && (uVar5 != 3 || (uVar7 & 1) != 0)) {
      if (s->fp_access_checked != true) {
        pTVar1 = s->uc->tcg_ctx;
        s->fp_access_checked = true;
        uVar3 = s->fp_excp_el;
        if (uVar3 == 0) {
          tcg_gen_gvec_dup_mem_aarch64
                    (pTVar1,uVar5,destidx * 0x100 + 0xc10,
                     srcidx * 0x100 + 0xc10 +
                     ((uVar8 >> ((byte)uVar5 + 1 & 0x1f)) << ((byte)uVar5 & 0x1f)),
                     (uVar7 & 1) * 8 + 8,s->sve_len);
          return;
        }
        goto LAB_006a8e3e;
      }
LAB_006a8ec5:
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    break;
  case 1:
    if (uVar8 == 0) {
      uVar5 = 0x20;
    }
    else {
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
    }
    if ((3 < uVar5) || (uVar5 == 3 && (uVar7 & 1) == 0)) break;
    if (s->fp_access_checked == true) goto LAB_006a8ec5;
    pTVar1 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    uVar3 = s->fp_excp_el;
    if (uVar3 == 0) {
      uVar3 = s->sve_len;
      pTVar2 = cpu_reg_aarch64(s,srcidx);
      tcg_gen_gvec_dup_i64_aarch64
                (pTVar1,uVar5,destidx * 0x100 + 0xc10,(uVar7 & 1) * 8 + 8,uVar3,pTVar2);
      return;
    }
    goto LAB_006a8e3e;
  case 3:
    if ((uVar7 & 1) != 0) {
      if (uVar8 == 0) {
        MVar4 = MO_ALIGN_4;
      }
      else {
        MVar4 = MO_8;
        if (uVar8 != 0) {
          for (; (uVar8 >> MVar4 & 1) == 0; MVar4 = MVar4 + MO_16) {
          }
        }
      }
      if (MVar4 < MO_ASHIFT) {
        if (s->fp_access_checked == true) goto LAB_006a8ec5;
        s->fp_access_checked = true;
        uVar3 = s->fp_excp_el;
        if (uVar3 == 0) {
          pTVar2 = cpu_reg_aarch64(s,srcidx);
          write_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar2,destidx,
                            0xfU >> ((byte)MVar4 & 0x1f) & uVar8 >> ((byte)MVar4 + 1 & 0x1f),MVar4);
          goto LAB_006a8b7c;
        }
        goto LAB_006a8e3e;
      }
    }
    break;
  case 5:
  case 7:
    if (uVar8 == 0) {
      MVar4 = MO_ALIGN_4;
    }
    else {
      MVar4 = MO_8;
      if (uVar8 != 0) {
        for (; (uVar8 >> MVar4 & 1) == 0; MVar4 = MVar4 + MO_16) {
        }
      }
    }
    pTVar1 = s->uc->tcg_ctx;
    if (uVar5 == 5) {
      if ((MO_32 < MVar4) || ((uVar7 & 1) == 0 && MVar4 == MO_32)) break;
    }
    else if ((MO_64 < MVar4) || (((MVar4 != MO_64 ^ bVar6) & 1) == 0)) break;
    if (s->fp_access_checked == true) goto LAB_006a8ec5;
    s->fp_access_checked = true;
    uVar3 = s->fp_excp_el;
    if (uVar3 == 0) {
      pTVar2 = cpu_reg_aarch64(s,destidx);
      read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar2,srcidx,
                       uVar8 >> ((char)MVar4 + 1U & 0x1f),(uint)(uVar5 == 5) << 2 | MVar4);
      if ((bVar6 & 1) != 0 || uVar5 != 5) {
        return;
      }
      tcg_gen_ext32u_i64_aarch64(pTVar1,pTVar2,pTVar2);
      return;
    }
LAB_006a8e3e:
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,uVar3);
    return;
  }
switchD_006a8a92_caseD_2:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_simd_copy(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int imm4 = extract32(insn, 11, 4);
    int op = extract32(insn, 29, 1);
    int is_q = extract32(insn, 30, 1);
    int imm5 = extract32(insn, 16, 5);

    if (op) {
        if (is_q) {
            /* INS (element) */
            handle_simd_inse(s, rd, rn, imm4, imm5);
        } else {
            unallocated_encoding(s);
        }
    } else {
        switch (imm4) {
        case 0:
            /* DUP (element - vector) */
            handle_simd_dupe(s, is_q, rd, rn, imm5);
            break;
        case 1:
            /* DUP (general) */
            handle_simd_dupg(s, is_q, rd, rn, imm5);
            break;
        case 3:
            if (is_q) {
                /* INS (general) */
                handle_simd_insg(s, rd, rn, imm5);
            } else {
                unallocated_encoding(s);
            }
            break;
        case 5:
        case 7:
            /* UMOV/SMOV (is_q indicates 32/64; imm4 indicates signedness) */
            handle_simd_umov_smov(s, is_q, (imm4 == 5), rn, rd, imm5);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
    }
}